

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O0

void pbrt::detail::
     stringPrintfRecursive<int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
               (string *s,char *fmt,int *v,
               vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
               *args,long *args_1,bool *args_2,long *args_3,int *args_4,int *args_5)

{
  long lVar1;
  ulong uVar2;
  int *in_RDX;
  string *in_RDI;
  long *in_R9;
  byte bVar3;
  byte bVar4;
  undefined1 uVar5;
  vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
  *in_stack_00000008;
  int *in_stack_00000010;
  string *in_stack_00000018;
  stringstream ss;
  bool isDFmt;
  bool isSFmt;
  bool precisionViaArg;
  string nextFmt;
  char *in_stack_fffffffffffffd68;
  string *in_stack_fffffffffffffd70;
  char **in_stack_fffffffffffffd78;
  char **in_stack_fffffffffffffd80;
  long *in_stack_fffffffffffffd88;
  int *in_stack_fffffffffffffd90;
  int *in_stack_fffffffffffffd98;
  string local_260 [32];
  undefined8 local_240;
  string local_238 [32];
  char *in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdf4;
  char *in_stack_fffffffffffffdf8;
  LogLevel in_stack_fffffffffffffe04;
  string local_90 [8];
  long *in_stack_ffffffffffffff78;
  bool *in_stack_ffffffffffffff80;
  long *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  char *in_stack_ffffffffffffff98;
  undefined5 in_stack_ffffffffffffffa0;
  string local_58 [8];
  int *in_stack_ffffffffffffffb0;
  int *in_stack_ffffffffffffffb8;
  
  copyToFormatString(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
  lVar1 = std::__cxx11::string::find((char)local_58,0x2a);
  bVar3 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_58,0x73);
  bVar4 = lVar1 != -1;
  lVar1 = std::__cxx11::string::find((char)local_58,100);
  uVar5 = lVar1 != -1;
  if ((bVar3 & 1) == 0) {
    if ((bool)uVar5) {
      uVar2 = std::__cxx11::string::find((char)local_58,100);
      IntegerFormatTrait<int>::fmt();
      std::__cxx11::string::replace((ulong)local_58,uVar2,(char *)0x1);
      std::__cxx11::string::c_str();
      formatOne<int_const&>((char *)in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,local_90);
      std::__cxx11::string::~string(local_90);
    }
    else if ((bVar4 & 1) == 0) {
      uVar2 = std::__cxx11::string::empty();
      if ((uVar2 & 1) != 0) {
        LogFatal(in_stack_fffffffffffffe04,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,
                 in_stack_fffffffffffffde8);
      }
      std::__cxx11::string::c_str();
      formatOne<int_const&>((char *)in_stack_fffffffffffffd88,(int *)in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,(string *)&stack0xfffffffffffffd80);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd80);
    }
    else {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffde8);
      std::ostream::operator<<(&stack0xfffffffffffffdf8,*in_RDX);
      std::__cxx11::string::c_str();
      std::__cxx11::stringstream::str();
      local_240 = std::__cxx11::string::c_str();
      formatOne<char_const*>((char *)in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
      std::__cxx11::string::operator+=(in_RDI,local_238);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::stringstream::~stringstream((stringstream *)&stack0xfffffffffffffde8);
    }
    stringPrintfRecursive<pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
              ((string *)CONCAT17(bVar3,CONCAT16(bVar4,CONCAT15(uVar5,in_stack_ffffffffffffffa0))),
               in_stack_ffffffffffffff98,
               (vector<pbrt::MLTSampler::PrimarySample,_pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>_>
                *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  }
  else {
    stringPrintfRecursiveWithPrecision<int_const&,pstd::vector<pbrt::MLTSampler::PrimarySample,pstd::pmr::polymorphic_allocator<pbrt::MLTSampler::PrimarySample>>const&,long_const&,bool_const&,long_const&,int_const&,int_const&>
              (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_00000018,
               in_stack_00000010,in_stack_00000008,in_R9,(bool *)in_stack_fffffffffffffd80,
               in_stack_fffffffffffffd88,in_stack_fffffffffffffd90,in_stack_fffffffffffffd98);
  }
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}